

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_seckey_tweak_add(secp256k1_context *ctx,uchar *seckey,uchar *tweak32)

{
  uint uVar1;
  uint uVar2;
  undefined1 local_48 [4];
  int ret;
  secp256k1_scalar sec;
  uchar *tweak32_local;
  uchar *seckey_local;
  secp256k1_context *ctx_local;
  
  sec.d[3] = (uint64_t)tweak32;
  if (seckey == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"seckey != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (tweak32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"tweak32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    uVar1 = secp256k1_scalar_set_b32_seckey((secp256k1_scalar *)local_48,seckey);
    uVar2 = secp256k1_ec_seckey_tweak_add_helper((secp256k1_scalar *)local_48,(uchar *)sec.d[3]);
    ctx_local._4_4_ = uVar2 & uVar1;
    secp256k1_scalar_cmov
              ((secp256k1_scalar *)local_48,&secp256k1_scalar_zero,
               (uint)((ctx_local._4_4_ != 0 ^ 0xffU) & 1));
    secp256k1_scalar_get_b32(seckey,(secp256k1_scalar *)local_48);
    secp256k1_scalar_clear((secp256k1_scalar *)local_48);
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ec_seckey_tweak_add(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak32) {
    secp256k1_scalar sec;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak32 != NULL);

    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    ret &= secp256k1_ec_seckey_tweak_add_helper(&sec, tweak32);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    return ret;
}